

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

bool __thiscall ON_SubDMeshFragment::DeleteManagedArrays(ON_SubDMeshFragment *this)

{
  double *pdVar1;
  bool bVar2;
  double *managed_array;
  ON_SubDMeshFragment *this_local;
  
  bVar2 = ManagedArrays(this);
  if (bVar2) {
    pdVar1 = this->m_P;
    this->m_vertex_count_etc = this->m_vertex_count_etc & 0x8000;
    this->m_vertex_capacity_etc = 0;
    this->m_P = (double *)0x0;
    this->m_N = (double *)0x0;
    this->m_T = (double *)0x0;
    this->m_C = (ON_Color *)0x0;
    this->m_K = (ON_SurfaceCurvature *)0x0;
    this->m_P_stride = 0;
    this->m_N_stride = 0;
    this->m_T_stride = 0;
    this->m_C_stride = 0;
    this->m_K_stride = 0;
    if ((pdVar1 != (double *)0x0) && (pdVar1 != (double *)0x0)) {
      operator_delete__(pdVar1);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDMeshFragment::DeleteManagedArrays()
{
  if (ManagedArrays())
  {
    double* managed_array = m_P;
    m_vertex_count_etc &= ON_SubDMeshFragment::EtcControlNetQuadBit;
    m_vertex_capacity_etc = 0;
    m_P = nullptr;
    m_N = nullptr;
    m_T = nullptr;
    m_C = nullptr;
    m_K = nullptr;
    m_P_stride = 0;
    m_N_stride = 0;
    m_T_stride = 0;
    m_C_stride = 0;
    m_K_stride = 0;
    if (nullptr != managed_array)
    {
      // Allocated in ON_SubDMeshFragment::ReserveManagedVertexCapacity()
      delete[] managed_array;
    }
    return true;
  }
  return false;
}